

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QPointer<QAbstractItemDelegate> __thiscall
QMap<int,_QPointer<QAbstractItemDelegate>_>::value
          (QMap<int,_QPointer<QAbstractItemDelegate>_> *this,int *key,
          QPointer<QAbstractItemDelegate> *defaultValue)

{
  int iVar1;
  long *in_RCX;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar2;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  QPointer<QAbstractItemDelegate> QVar7;
  
  lVar4 = *(long *)key;
  if (lVar4 != 0) {
    lVar6 = *(long *)(lVar4 + 0x18);
    lVar4 = lVar4 + 0x10;
    lVar5 = lVar4;
    if (lVar6 != 0) {
      iVar1 = *(int *)&(defaultValue->wp).d;
      do {
        if (iVar1 <= *(int *)(lVar6 + 0x20)) {
          lVar5 = lVar6;
        }
        lVar6 = *(long *)(lVar6 + 0x10 + (ulong)(*(int *)(lVar6 + 0x20) < iVar1) * 8);
      } while (lVar6 != 0);
    }
    lVar6 = lVar4;
    if ((lVar5 != lVar4) && (lVar6 = lVar5, *(int *)&(defaultValue->wp).d < *(int *)(lVar5 + 0x20)))
    {
      lVar6 = lVar4;
    }
    if (lVar6 != lVar4) {
      pQVar3 = *(QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 **)(lVar6 + 0x28);
      (this->d).d.ptr = pQVar3;
      pQVar2 = *(QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 **)(lVar6 + 0x30);
      goto LAB_00547ee2;
    }
  }
  pQVar3 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
            *)*in_RCX;
  (this->d).d.ptr = pQVar3;
  pQVar2 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
            *)in_RCX[1];
LAB_00547ee2:
  this[1].d.d.ptr = pQVar2;
  if (pQVar3 != (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  QVar7.wp.value = (QObject *)pQVar3;
  QVar7.wp.d = (Data *)this;
  return (QPointer<QAbstractItemDelegate>)QVar7.wp;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }